

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O2

bool basisu::read_file_to_vec(char *pFilename,uint8_vec *data)

{
  bool bVar1;
  FILE *__stream;
  size_t new_size_size_t;
  uchar *__ptr;
  size_t sVar2;
  bool bVar3;
  
  __stream = fopen(pFilename,"rb");
  if (__stream == (FILE *)0x0) {
    return false;
  }
  bVar3 = false;
  fseek(__stream,0,2);
  new_size_size_t = ftello(__stream);
  if (-1 < (long)new_size_size_t) {
    bVar3 = false;
    fseek(__stream,0,0);
    bVar1 = vector<unsigned_char>::try_resize(data,new_size_size_t,false);
    if (bVar1) {
      if (new_size_size_t != 0) {
        bVar3 = false;
        __ptr = vector<unsigned_char>::operator[](data,0);
        sVar2 = fread(__ptr,1,new_size_size_t,__stream);
        if (sVar2 != new_size_size_t) goto LAB_0021c780;
      }
      bVar3 = true;
    }
  }
LAB_0021c780:
  fclose(__stream);
  return bVar3;
}

Assistant:

bool read_file_to_vec(const char* pFilename, uint8_vec& data)
	{
		FILE* pFile = nullptr;
#ifdef _WIN32
		fopen_s(&pFile, pFilename, "rb");
#else
		pFile = fopen(pFilename, "rb");
#endif
		if (!pFile)
			return false;
				
		fseek(pFile, 0, SEEK_END);
#ifdef _WIN32
		int64_t filesize = _ftelli64(pFile);
#else
		int64_t filesize = ftello(pFile);
#endif
		if (filesize < 0)
		{
			fclose(pFile);
			return false;
		}
		fseek(pFile, 0, SEEK_SET);

		if (sizeof(size_t) == sizeof(uint32_t))
		{
			if (filesize > 0x70000000)
			{
				// File might be too big to load safely in one alloc
				fclose(pFile);
				return false;
			}
		}

		if (!data.try_resize((size_t)filesize))
		{
			fclose(pFile);
			return false;
		}

		if (filesize)
		{
			if (fread(&data[0], 1, (size_t)filesize, pFile) != (size_t)filesize)
			{
				fclose(pFile);
				return false;
			}
		}

		fclose(pFile);
		return true;
	}